

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.h
# Opt level: O2

stref idx2::ToString(mmap_err_code Enum)

{
  long lVar1;
  long lVar2;
  stref sVar3;
  mmap_err_code_s EnumS;
  
  mmap_err_code_s::mmap_err_code_s(&EnumS,Enum);
  lVar1 = -0x18;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x270) {
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.h"
                    ,0x28,"stref idx2::ToString(mmap_err_code)");
    }
    lVar1 = lVar2 + 0x18;
  } while (*(mmap_err_code *)((long)&mmap_err_code_s::NameMap.Arr[1].ItemVal + lVar2) != EnumS.Val);
  sVar3._12_4_ = 0;
  sVar3._0_12_ = *(undefined1 (*) [12])((long)&mmap_err_code_s::NameMap.Arr[1].Name.field_0 + lVar2)
  ;
  return sVar3;
}

Assistant:

idx2_Enum(mmap_err_code,
          int,
          idx2_CommonErrs,
          MappingFailed,
          MapViewFailed,
          AllocateFailed,
          FlushFailed,
          SyncFailed,
          UnmapFailed);


namespace idx2
{


enum class map_mode
{
  Read,
  Write
};

#if defined(_WIN32)
using file_handle = HANDLE;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
using file_handle = int;
#endif

struct mmap_file
{
  file_handle File;
  file_handle FileMapping;
  map_mode Mode;
  buffer Buf;
};

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode);

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes = 0);

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start = nullptr, i64 Bytes = 0);

error<mmap_err_code>
SyncFile(mmap_file* MMap);

error<mmap_err_code>
UnmapFile(mmap_file* MMap);

error<mmap_err_code>
CloseFile(mmap_file* MMap);

template <typename t> void
Write(mmap_file* MMap, const t* Data);

template <typename t> void
Write(mmap_file* MMap, const t* Data, i64 Size);

template <typename t> void
Write(mmap_file* MMap, t Val);


}